

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcTangentsProcess.cpp
# Opt level: O3

void __thiscall Assimp::CalcTangentsProcess::Execute(CalcTangentsProcess *this,aiScene *pScene)

{
  byte bVar1;
  bool bVar2;
  Logger *pLVar3;
  byte bVar4;
  ulong uVar5;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/CalcTangentsProcess.cpp"
                  ,0x60,"virtual void Assimp::CalcTangentsProcess::Execute(aiScene *)");
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"CalcTangentsProcess begin");
  if (pScene->mNumMeshes != 0) {
    uVar5 = 0;
    bVar1 = 0;
    do {
      bVar4 = bVar1;
      bVar2 = ProcessMesh(this,pScene->mMeshes[uVar5],(uint)uVar5);
      uVar5 = uVar5 + 1;
      bVar1 = bVar4 | bVar2;
    } while (uVar5 < pScene->mNumMeshes);
    if (bVar4 != 0 || bVar2) {
      pLVar3 = DefaultLogger::get();
      Logger::info(pLVar3,"CalcTangentsProcess finished. Tangents have been calculated");
      return;
    }
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"CalcTangentsProcess finished");
  return;
}

Assistant:

void CalcTangentsProcess::Execute( aiScene* pScene)
{
    ai_assert( NULL != pScene );

    ASSIMP_LOG_DEBUG("CalcTangentsProcess begin");

    bool bHas = false;
    for ( unsigned int a = 0; a < pScene->mNumMeshes; a++ ) {
        if(ProcessMesh( pScene->mMeshes[a],a))bHas = true;
    }

    if ( bHas ) {
        ASSIMP_LOG_INFO("CalcTangentsProcess finished. Tangents have been calculated");
    } else {
        ASSIMP_LOG_DEBUG("CalcTangentsProcess finished");
    }
}